

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl.cpp
# Opt level: O2

bool __thiscall pg::DTLSolver::extractTangles(DTLSolver *this,int startvertex,bitset *R,int *str)

{
  uint uVar1;
  int iVar2;
  uint64_t *puVar3;
  uint64_t *puVar4;
  vector<int,_std::allocator<int>_> *pvVar5;
  bool bVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  uint *puVar10;
  ostream *poVar11;
  pointer piVar12;
  long lVar13;
  Error *this_00;
  byte bVar14;
  int iVar15;
  ulong uVar16;
  ulong *puVar17;
  int *piVar18;
  uint *puVar19;
  Game *pGVar20;
  pointer piVar21;
  ulong uVar22;
  Game *pGVar23;
  uint uVar24;
  iterator __begin2;
  uint *puVar25;
  int *piVar26;
  pointer ppiVar27;
  ulong uVar28;
  ulong uVar29;
  int *piVar30;
  uint uVar31;
  int *_tout;
  uint local_98;
  Game *local_90;
  int pr;
  uint *local_80;
  undefined8 local_78;
  int tidx;
  vector<int,_std::allocator<int>_> *__range5;
  vector<int_*,_std::allocator<int_*>_> *local_60;
  vector<int,_std::allocator<int>_> *local_58;
  vector<int_*,_std::allocator<int_*>_> *local_50;
  vector<int,_std::allocator<int>_> *local_48;
  bitset *local_40;
  int *_vv;
  
  uVar9 = (ulong)startvertex;
  pr = ((this->super_Solver).game)->_priority[uVar9];
  uVar31 = pr & 1;
  iVar15 = (this->pea_vS).pointer;
  (this->pea_vS).pointer = iVar15 + 1;
  (this->pea_vS).queue[iVar15] = startvertex;
  iVar15 = (this->pea_iS).pointer;
  (this->pea_iS).pointer = iVar15 + 1;
  (this->pea_iS).queue[iVar15] = 0;
  local_78 = 0;
  puVar17 = (this->pea_root)._bits + (uVar9 >> 6);
  *puVar17 = *puVar17 | 1L << (uVar9 & 0x3f);
  uVar8 = this->pea_curidx;
  this->pea_curidx = uVar8 + 1;
  this->pea_vidx[uVar9] = uVar8;
  __range5 = &this->tangle;
  local_50 = &this->tv;
  local_58 = &this->tpr;
  local_60 = &this->tout;
  local_48 = &this->dom_vector;
  local_90 = (Game *)str;
  local_40 = R;
LAB_00163010:
  do {
    if ((this->pea_vS).pointer == 0) {
      (this->pea_S).pointer = 0;
      return (bool)((byte)local_78 & 1);
    }
LAB_0016301e:
    uVar8 = (this->pea_vS).queue[(long)(this->pea_vS).pointer + -1];
    uVar9 = (ulong)uVar8;
    uVar24 = (this->pea_iS).queue[(long)(this->pea_iS).pointer + -1];
    uVar7 = Solver::owner(&this->super_Solver,uVar8);
    pvVar5 = __range5;
    bVar14 = (byte)uVar8;
    if (uVar7 != uVar31) {
      pGVar20 = (this->super_Solver).game;
      puVar10 = this->pea_vidx;
      iVar15 = pGVar20->_firstouts[(int)uVar8];
      piVar30 = pGVar20->_outedges;
      if ((uVar24 != 0) && (puVar10[piVar30[(long)iVar15 + (ulong)(uVar24 - 1)]] < puVar10[uVar9]))
      {
        puVar10[uVar9] = puVar10[piVar30[(long)iVar15 + (ulong)(uVar24 - 1)]];
        puVar17 = (this->pea_root)._bits + (uVar8 >> 6);
        *puVar17 = *puVar17 &
                   (-2L << (bVar14 & 0x3f) | 0xfffffffffffffffeU >> 0x40 - (bVar14 & 0x3f));
        puVar10 = this->pea_vidx;
      }
      puVar3 = (this->pea_root)._bits;
      uVar29 = (ulong)(uVar8 >> 6);
      uVar28 = 1L << (uVar9 & 0x3f);
      puVar4 = local_40->_bits;
      do {
        uVar1 = piVar30[(long)iVar15 + (ulong)uVar24];
        uVar22 = (ulong)(int)uVar1;
        if (uVar22 == 0xffffffffffffffff) goto LAB_0016320d;
        uVar16 = uVar22 >> 6;
        if ((puVar4[uVar16] >> (uVar22 & 0x3f) & 1) != 0) {
          uVar7 = puVar10[uVar22];
          if (uVar7 == 0) goto LAB_00163188;
          if (uVar7 < puVar10[uVar9]) {
            puVar10[uVar9] = uVar7;
            puVar17 = puVar3 + uVar29;
            *puVar17 = *puVar17 &
                       (-2L << (bVar14 & 0x3f) | 0xfffffffffffffffeU >> 0x40 - (bVar14 & 0x3f));
          }
        }
        uVar24 = uVar24 + 1;
      } while( true );
    }
    uVar1 = *(uint *)((long)&local_90->n_vertices + uVar9 * 4);
    puVar10 = this->pea_vidx;
    uVar22 = (ulong)(int)uVar1;
    uVar7 = puVar10[uVar22];
    if (uVar24 == 0 && uVar7 == 0) {
      puVar25 = (this->pea_iS).queue;
      puVar10 = puVar10 + uVar22;
      puVar25[(long)(this->pea_iS).pointer + -1] = 1;
      iVar15 = (this->pea_vS).pointer;
      (this->pea_vS).pointer = iVar15 + 1;
      (this->pea_vS).queue[iVar15] = uVar1;
      iVar15 = (this->pea_iS).pointer;
      (this->pea_iS).pointer = iVar15 + 1;
      puVar25[iVar15] = 0;
      uVar16 = uVar22 >> 6;
      goto LAB_001631e1;
    }
    if (uVar7 < puVar10[uVar9]) {
      puVar10[uVar9] = uVar7;
      uVar29 = (ulong)(uVar8 >> 6);
      uVar28 = 1L << (uVar9 & 0x3f);
      puVar17 = (this->pea_root)._bits + uVar29;
      *puVar17 = *puVar17 & (-2L << (bVar14 & 0x3f) | 0xfffffffffffffffeU >> 0x40 - (bVar14 & 0x3f))
      ;
    }
    else {
      uVar29 = (ulong)(uVar8 >> 6);
      uVar28 = 1L << (uVar9 & 0x3f);
    }
LAB_0016320d:
    piVar30 = &(this->pea_vS).pointer;
    *piVar30 = *piVar30 + -1;
    piVar30 = &(this->pea_iS).pointer;
    *piVar30 = *piVar30 + -1;
    if (((this->pea_root)._bits[uVar29] & uVar28) == 0) {
      iVar15 = (this->pea_S).pointer;
      (this->pea_S).pointer = iVar15 + 1;
      (this->pea_S).queue[iVar15] = uVar8;
      goto LAB_00163010;
    }
    this->pea_curidx = this->pea_curidx + -1;
    _tout = (int *)CONCAT44(_tout._4_4_,uVar8);
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(__range5,(int *)&_tout);
    while( true ) {
      iVar15 = (this->pea_S).pointer;
      if ((long)iVar15 == 0) break;
      uVar1 = (this->pea_S).queue[(long)iVar15 + -1];
      _tout = (int *)CONCAT44(_tout._4_4_,uVar1);
      puVar10 = this->pea_vidx;
      if (puVar10[(int)uVar1] < puVar10[uVar9]) goto LAB_001632b4;
      (this->pea_S).pointer = iVar15 + -1;
      this->pea_curidx = this->pea_curidx + -1;
      puVar10[(int)uVar1] = 0xffffffff;
      std::vector<int,_std::allocator<int>_>::push_back(pvVar5,(value_type_conflict3 *)&_tout);
    }
    puVar10 = this->pea_vidx;
LAB_001632b4:
    puVar10[uVar9] = 0xffffffff;
    piVar30 = (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish;
    piVar26 = (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (((ulong)((long)piVar30 - (long)piVar26) < 5) &&
       (uVar24 = *(uint *)((long)&local_90->n_vertices + uVar9 * 4), uVar24 != uVar8)) {
      if (uVar24 == 0xffffffff) {
        bVar6 = Game::has_edge((this->super_Solver).game,uVar8,uVar8);
        piVar26 = (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        piVar30 = (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        if (bVar6) goto LAB_001632e5;
      }
      if (piVar30 != piVar26) {
        (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
        ._M_finish = piVar26;
      }
    }
    else {
LAB_001632e5:
      puVar3 = (this->escapes)._bits;
      for (piVar18 = piVar26; piVar18 != piVar30; piVar18 = piVar18 + 1) {
        puVar17 = puVar3 + ((ulong)(long)*piVar18 >> 6);
        *puVar17 = *puVar17 | 1L << ((long)*piVar18 & 0x3fU);
      }
      for (; piVar26 != piVar30; piVar26 = piVar26 + 1) {
        iVar15 = *piVar26;
        uVar8 = Solver::owner(&this->super_Solver,iVar15);
        if (uVar8 != uVar31) {
          pGVar20 = (this->super_Solver).game;
          puVar25 = (this->tangleto).queue;
          puVar3 = (this->escapes)._bits;
          puVar19 = (uint *)(pGVar20->_outedges + pGVar20->_firstouts[iVar15]);
          puVar4 = (this->G)._bits;
          while( true ) {
            uVar1 = *puVar19;
            uVar9 = (ulong)(int)uVar1;
            if (uVar9 == 0xffffffffffffffff) break;
            uVar29 = uVar9 >> 6;
            if ((puVar4[uVar29] >> (uVar9 & 0x3f) & 1) != 0) {
              uVar28 = puVar3[uVar29];
              uVar9 = 1L << (uVar9 & 0x3f);
              if ((uVar28 & uVar9) == 0) {
                puVar3[uVar29] = uVar28 | uVar9;
                iVar15 = (this->tangleto).pointer;
                (this->tangleto).pointer = iVar15 + 1;
                puVar25[iVar15] = uVar1;
              }
            }
            puVar19 = puVar19 + 1;
          }
        }
      }
      puVar3 = (this->escapes)._bits;
      pGVar20 = (Game *)((this->escapes)._bitssize << 3);
      for (pGVar23 = (Game *)0x0; pGVar20 != pGVar23; pGVar23 = (Game *)&pGVar23->n_edges) {
        *(undefined8 *)((long)&pGVar23->n_vertices + (long)puVar3) = 0;
      }
      if ((this->tangleto).pointer == 0) {
        if ((this->super_Solver).trace != 0) {
          poVar11 = std::operator<<((this->super_Solver).logger,"\x1b[1;38;5;201mdominion \x1b[36m")
          ;
          poVar11 = (ostream *)std::ostream::operator<<(poVar11,pr);
          std::operator<<(poVar11,"\x1b[m");
          poVar11 = std::operator<<((this->super_Solver).logger," (depth ");
          poVar11 = (ostream *)std::ostream::operator<<(poVar11,this->cur_depth);
          std::operator<<(poVar11,")");
          if (this->cur_depth != 0) {
            this_00 = (Error *)__cxa_allocate_exception(0x40);
            Error::Error(this_00,"logic error",
                         "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]oink/src/solvers/dtl.cpp"
                         ,0x161);
            __cxa_throw(this_00,&Error::typeinfo,Error::~Error);
          }
          if (1 < (this->super_Solver).trace) {
            local_80 = (uint *)(this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish;
            for (puVar10 = (uint *)(this->tangle).super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_start; puVar10 != local_80;
                puVar10 = puVar10 + 1) {
              uVar8 = *puVar10;
              poVar11 = std::operator<<((this->super_Solver).logger," \x1b[1;36m");
              pGVar20 = (this->super_Solver).game;
              _tout = (int *)pGVar20;
              local_98 = uVar8;
              poVar11 = operator<<(poVar11,(_label_vertex *)&_tout);
              std::operator<<(poVar11,"\x1b[m");
              pGVar23 = local_90;
              if (*(int *)((long)&local_90->n_vertices + (long)(int)uVar8 * 4) != -1) {
                poVar11 = std::operator<<((this->super_Solver).logger,"->");
                local_98 = *(uint *)((long)&pGVar23->n_vertices + (long)(int)uVar8 * 4);
                pGVar20 = (Game *)(ulong)local_98;
                _tout = (int *)(this->super_Solver).game;
                operator<<(poVar11,(_label_vertex *)&_tout);
              }
            }
          }
          std::endl<char,std::char_traits<char>>((this->super_Solver).logger);
        }
        puVar19 = (uint *)(this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish;
        for (puVar25 = (uint *)(this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start; pvVar5 = local_48,
            puVar25 != puVar19; puVar25 = puVar25 + 1) {
          uVar1 = *puVar25;
          uVar9 = (ulong)(int)uVar1;
          _tout = (int *)CONCAT44(_tout._4_4_,uVar1);
          pGVar20 = (Game *)(this->S)._bits;
          if (((ulong)(&pGVar20->n_vertices)[uVar9 >> 6] >> (uVar9 & 0x3f) & 1) == 0) {
            (&pGVar20->n_vertices)[uVar9 >> 6] =
                 (&pGVar20->n_vertices)[uVar9 >> 6] | 1L << (uVar9 & 0x3f);
            iVar15 = (this->SQ).pointer;
            (this->SQ).pointer = iVar15 + 1;
            (this->SQ).queue[iVar15] = uVar1;
            std::vector<int,_std::allocator<int>_>::push_back
                      (local_48,(value_type_conflict3 *)&_tout);
            pGVar20 = local_90;
            std::vector<int,_std::allocator<int>_>::push_back
                      (pvVar5,(value_type_conflict3 *)
                              ((long)&local_90->n_vertices + (long)(int)_tout * 4));
          }
        }
        this->dominions = this->dominions + 1;
        local_78 = CONCAT71((int7)((ulong)pGVar20 >> 8),1);
        piVar21 = (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if ((this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish != piVar21) {
          (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = piVar21;
        }
      }
      else {
        std::
        __sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  ((this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish);
        piVar21 = (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        piVar12 = (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        ppiVar27 = (this->tv).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        bVar6 = false;
        uVar9 = (ulong)((long)piVar21 - (long)piVar12) >> 2;
        do {
          if (ppiVar27 ==
              (this->tv).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
              super__Vector_impl_data._M_finish) break;
          uVar29 = 0;
          do {
            if ((uVar9 & 0xffffffff) == uVar29) {
              if ((*ppiVar27)[(uint)((int)uVar9 * 2)] == -1) {
                bVar6 = true;
              }
              break;
            }
            lVar13 = uVar29 * 2;
            piVar30 = piVar12 + uVar29;
            uVar29 = uVar29 + 1;
          } while ((*ppiVar27)[lVar13] == *piVar30);
          ppiVar27 = ppiVar27 + 1;
        } while (!bVar6);
        iVar15 = (this->super_Solver).trace;
        if (bVar6) {
          if (0 < iVar15) {
            std::operator<<((this->super_Solver).logger,"\x1b[1;38;5;198mduplicate tangle\x1b[m");
            if (1 < (this->super_Solver).trace) {
              local_80 = (uint *)(this->tangle).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish;
              for (puVar10 = (uint *)(this->tangle).super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_start; puVar10 != local_80;
                  puVar10 = puVar10 + 1) {
                poVar11 = std::operator<<((this->super_Solver).logger," \x1b[1;36m");
                local_98 = *puVar10;
                _tout = (int *)(this->super_Solver).game;
                poVar11 = operator<<(poVar11,(_label_vertex *)&_tout);
                std::operator<<(poVar11,"\x1b[m");
                pGVar20 = local_90;
                if (*(int *)((long)&local_90->n_vertices + (long)(int)*puVar10 * 4) != -1) {
                  poVar11 = std::operator<<((this->super_Solver).logger,"->");
                  _tout = (int *)(this->super_Solver).game;
                  local_98 = *(uint *)((long)&pGVar20->n_vertices + (long)(int)*puVar10 * 4);
                  operator<<(poVar11,(_label_vertex *)&_tout);
                }
              }
            }
            std::endl<char,std::char_traits<char>>((this->super_Solver).logger);
            piVar12 = (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            piVar21 = (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          }
          if (piVar21 != piVar12) {
            (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = piVar12;
          }
          (this->tangleto).pointer = 0;
        }
        else {
          if (0 < iVar15) {
            poVar11 = std::operator<<((this->super_Solver).logger,"\x1b[1;38;5;198mnew tangle ");
            poVar11 = (ostream *)std::ostream::operator<<(poVar11,pr);
            poVar11 = std::operator<<(poVar11,"\x1b[m (");
            poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
            std::operator<<(poVar11,")");
            poVar11 = std::operator<<((this->super_Solver).logger," (depth ");
            poVar11 = (ostream *)std::ostream::operator<<(poVar11,this->cur_depth);
            std::operator<<(poVar11,")");
            if (1 < (this->super_Solver).trace) {
              local_80 = (uint *)(this->tangle).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish;
              for (puVar10 = (uint *)(this->tangle).super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_start; puVar10 != local_80;
                  puVar10 = puVar10 + 1) {
                uVar8 = *puVar10;
                poVar11 = std::operator<<((this->super_Solver).logger," \x1b[1;36m");
                _tout = (int *)(this->super_Solver).game;
                local_98 = uVar8;
                poVar11 = operator<<(poVar11,(_label_vertex *)&_tout);
                std::operator<<(poVar11,"\x1b[m");
                pGVar20 = local_90;
                if (*(int *)((long)&local_90->n_vertices + (long)(int)uVar8 * 4) != -1) {
                  poVar11 = std::operator<<((this->super_Solver).logger,"->");
                  local_98 = *(uint *)((long)&pGVar20->n_vertices + (long)(int)uVar8 * 4);
                  _tout = (int *)(this->super_Solver).game;
                  operator<<(poVar11,(_label_vertex *)&_tout);
                }
              }
            }
            poVar11 = std::operator<<((this->super_Solver).logger," with ");
            poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
            std::operator<<(poVar11," escape vertices.");
            std::endl<char,std::char_traits<char>>((this->super_Solver).logger);
          }
          uVar9 = 0;
          tidx = (int)((ulong)((long)(this->tpr).super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->tpr).super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_start) >> 2);
          while( true ) {
            uVar8 = (this->tangleto).pointer;
            if (uVar8 <= uVar9) break;
            std::vector<int,_std::allocator<int>_>::push_back
                      (this->tin + (this->tangleto).queue[uVar9],&tidx);
            uVar9 = uVar9 + 1;
          }
          _tout = (int *)operator_new__((ulong)(uVar8 + 1) << 2);
          puVar10 = (this->tangleto).queue;
          std::__copy_move<false,false,std::random_access_iterator_tag>::
          __copy_m<unsigned_int*,int*>(puVar10,puVar10 + uVar8,_tout);
          _tout[(uint)(this->tangleto).pointer] = -1;
          std::vector<int_*,_std::allocator<int_*>_>::push_back(local_60,&_tout);
          piVar30 = (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          piVar26 = (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          lVar13 = (long)piVar30 - (long)piVar26;
          _vv = (int *)operator_new__(-(ulong)((lVar13 >> 2 & 0x6000000000000000U) != 0) |
                                      lVar13 * 2 + 4U);
          piVar18 = _vv + 1;
          iVar15 = 0;
          for (; piVar26 != piVar30; piVar26 = piVar26 + 1) {
            iVar2 = *piVar26;
            iVar15 = iVar15 + -2;
            piVar18[-1] = iVar2;
            *piVar18 = *(int *)((long)&local_90->n_vertices + (long)iVar2 * 4);
            piVar18 = piVar18 + 2;
          }
          _vv[(uint)-iVar15] = -1;
          std::vector<int_*,_std::allocator<int_*>_>::push_back(local_50,&_vv);
          std::vector<int,_std::allocator<int>_>::push_back(local_58,&pr);
          this->tangles = this->tangles + 1;
          piVar21 = (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if ((this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish != piVar21) {
            (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = piVar21;
          }
          (this->tangleto).pointer = 0;
          local_78 = CONCAT71((int7)((ulong)piVar21 >> 8),1);
        }
      }
    }
  } while( true );
LAB_00163188:
  puVar10 = puVar10 + uVar22;
  puVar25 = (this->pea_iS).queue;
  puVar25[(long)(this->pea_iS).pointer + -1] = uVar24 + 1;
  iVar15 = (this->pea_vS).pointer;
  (this->pea_vS).pointer = iVar15 + 1;
  (this->pea_vS).queue[iVar15] = uVar1;
  iVar15 = (this->pea_iS).pointer;
  (this->pea_iS).pointer = iVar15 + 1;
  puVar25[iVar15] = 0;
LAB_001631e1:
  puVar17 = (this->pea_root)._bits + uVar16;
  *puVar17 = *puVar17 | 1L << (uVar22 & 0x3f);
  uVar8 = this->pea_curidx;
  this->pea_curidx = uVar8 + 1;
  *puVar10 = uVar8;
  goto LAB_0016301e;
}

Assistant:

bool
DTLSolver::extractTangles(int startvertex, bitset &R, int *str)
{
    bool new_tangles = false;
    const int pr = priority(startvertex);
    const int pl = pr&1;

    /**
     * The following is the nonrecursive implementation of David Pearce,
     * "A space-efficient algorithm for finding strongly connected components" (IPL, 2016),
     * modified to on-the-fly restrict the graph by <R> and <str>.
     */

    // beginVisiting
    pea_vS.push(startvertex);
    pea_iS.push(0);
    pea_root[startvertex] = true;
    pea_vidx[startvertex] = pea_curidx++;
    while (pea_vS.nonempty()) {
pearce_again:
        // visitLoop
        const unsigned int n = pea_vS.back();
        unsigned int i = pea_iS.back();

        if (owner(n) != pl) {
            auto edges = outs(n);
            if (i>0) {
                // finishEdge
                const int w = edges[i-1];
                if (pea_vidx[w] < pea_vidx[n]) {
                    pea_vidx[n] = pea_vidx[w];
                    pea_root[n] = false;
                }
            }
            for (;;) {
                const int to = edges[i];
                if (to == -1) break; // done
                // beginEdge
                if (R[to]) {
                    if (pea_vidx[to] == 0) {
                        pea_iS.back() = i+1;
                        // beginVisiting
                        pea_vS.push(to);
                        pea_iS.push(0);
                        pea_root[to] = true;
                        pea_vidx[to] = pea_curidx++;
                        goto pearce_again; // break; continue;
                    } else {
                        // finishEdge
                        if (pea_vidx[to] < pea_vidx[n]) {
                            pea_vidx[n] = pea_vidx[to];
                            pea_root[n] = false;
                        }
                    }
                }
                i++;
            }
        } else {
            const int s = str[n];
            if (i == 0) {
                // beginEdge
                if (pea_vidx[s] == 0) {
                    pea_iS.back() = 1;
                    // beginVisiting
                    pea_vS.push(s);
                    pea_iS.push(0);
                    pea_root[s] = true;
                    pea_vidx[s] = pea_curidx++;
                    goto pearce_again; // break; continue;
                }
            }
            // finishEdge
            if (pea_vidx[s] < pea_vidx[n]) {
                pea_vidx[n] = pea_vidx[s];
                pea_root[n] = false;
            }
        }
        // finishVisiting
        pea_vS.pop();
        pea_iS.pop();
        if (pea_root[n]) {
            pea_curidx -= 1;
            tangle.push_back(n);
            while (pea_S.nonempty()) {
                const int t = pea_S.back();
                if (pea_vidx[n]>pea_vidx[t]) break;
                pea_S.pop();
                pea_curidx -= 1;
                pea_vidx[t] = (unsigned int)-1;
                tangle.push_back(t);
            }
            pea_vidx[n] = (unsigned int)-1;
        } else {
            pea_S.push(n);
            continue;
        }

        /**
         * End of Pearce's algorithm.
         * At this point, we have an SCC in <tangle>.
         *
         * Now check if the SCC is nontrivial, i.e., contains a cycle, i.e., either 2+ vertices
         * or a self-loop.
         */

        const bool is_tangle = (tangle.size() > 1) or
            ((unsigned int)str[n] == n) or
            (str[n] == -1 and game.has_edge(n, n));
        if (!is_tangle) {
            tangle.clear();
            continue;
        }

        /**
         * We have a tangle. Compute the outgoing edges (into <tangleto>) and the next highest region.
         */

        for (const int v : tangle) escapes[v] = true;

        for (const int v : tangle) {
            if (owner(v) != pl) {
                for (auto curedge = outs(v); *curedge != -1; curedge++) {
                    int to = *curedge;
                    if (G[to] and !escapes[to]) {
                        escapes[to] = true;
                        tangleto.push(to);
                    }
                }
            }
        }

        escapes.reset();

        /**
         * If there are no outgoing edges, then we have found a dominion.
         */

        if (tangleto.empty()) {
            // dominion
            if (trace) {
                logger << "\033[1;38;5;201mdominion \033[36m" << pr << "\033[m";
                logger << " (depth " << cur_depth <<")";
                if (cur_depth != 0) {
                    LOGIC_ERROR;
                    exit(-1);
                }
#ifndef NDEBUG
                if (trace >= 2) {
                    for (const int v : tangle) {
                        logger << " \033[1;36m" << label_vertex(v) << "\033[m";
                        if (str[v] != -1) logger << "->" << label_vertex(str[v]);
                    }
                }
#endif
                logger << std::endl;
            }
            for (const int v : tangle) {
                // if not yet added to solve queue, mark and add it
                if (S[v] == false) {
                    S[v] = true;
                    SQ.push(v);
                    dom_vector.push_back(v);
                    dom_vector.push_back(str[v]);
                }
            }
            dominions++;
            tangle.clear();
            new_tangles = true;
            continue;
        }

        /**
         * We're not a dominion, we're a tangle.
         */

#if CHECK_UNIQUE
        /** 
         * First we sort.
         */
        std::sort(tangle.begin(), tangle.end());
        int tsize = tangle.size();

        /**
         * Then we check if it already exists.
         */
        bool already_exists = false;
        for (auto &_tv : tv) {
            for (int i=0; ; i++) {
                if (i == tsize) {
                    if (_tv[2*i] == -1) already_exists = true;
                    break;
                } else if (_tv[2*i] != tangle[i]) {
                    break;
                }
            }
            if (already_exists) break;
        }
        if (already_exists) {
            if (trace >= 1) {
                logger << "\033[1;38;5;198mduplicate tangle\033[m";
#ifndef NDEBUG
                if (trace >= 2) {
                    for (int &v : tangle) {
                        logger << " \033[1;36m" << label_vertex(v) << "\033[m";
                        if (str[v] != -1) logger << "->" << label_vertex(str[v]);
                    }
                }
#endif
                logger << std::endl;
            }
            tangle.clear();
            tangleto.clear();
            continue;
        }
#endif

        if (trace >= 1) {
            logger << "\033[1;38;5;198mnew tangle " << pr << "\033[m (" << tpr.size() << ")";
            logger << " (depth " << cur_depth <<")";
            if (trace >= 2) {
                for (const int v : tangle) {
                    logger << " \033[1;36m" << label_vertex(v) << "\033[m";
                    if (str[v] != -1) logger << "->" << label_vertex(str[v]);
                }
            }
            logger << " with " << tangleto.size() << " escape vertices.";
            logger << std::endl;
        }

        // new tangle idx
        const int tidx = tpr.size();

        // add back links to all normal vertices in our [out]
        for (unsigned int x = 0; x < tangleto.size(); x++) tin[tangleto[x]].push_back(tidx);

        // move tangleto into vout
        int* _tout = new int[tangleto.size()+1];
        std::copy(&tangleto[0], &tangleto[tangleto.size()], _tout);
        _tout[tangleto.size()] = -1;
        tout.push_back(_tout);

        // move tangle into vv
        int* _vv = new int[tangle.size()*2+1], c=0;
        for (const int v : tangle) {
            _vv[c++] = v;
            _vv[c++] = str[v];
        }
        _vv[c] = -1;
        tv.push_back(_vv);

        // and set p to pr
        tpr.push_back(pr);

        tangles++;
        new_tangles = true;
        tangle.clear();
        tangleto.clear();
    }

    pea_S.clear();
    return new_tangles;
}